

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  array<float,_4> aVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  Float FVar8;
  float fVar11;
  Float FVar9;
  Float FVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar21 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  float fVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  Vector3<float> VVar30;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  SampledSpectrum local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Normal3,_float> local_38;
  undefined1 auVar26 [60];
  
  auVar29._4_60_ = wi._12_60_;
  auVar29._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._8_56_ = wi._8_56_;
  auVar28._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._4_60_ = wo._12_60_;
  auVar23._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._8_56_ = wo._8_56_;
  auVar16._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_88._0_8_ = vmovlps_avx(auVar16._0_16_);
  local_98._0_8_ = vmovlps_avx(auVar28._0_16_);
  auVar7 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                      ZEXT416((uint)(this->mfDistrib).alpha_x));
  local_98.z = auVar29._0_4_;
  local_88.z = auVar23._0_4_;
  if (0.001 <= auVar7._0_4_) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = ZEXT812(0);
    auVar7 = auVar7 << 0x20;
    this_00 = &this->mfDistrib;
    if (auVar23._0_4_ * auVar29._0_4_ <= 0.0) {
      if (((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) &&
         ((auVar29._0_4_ != 0.0 || (NAN(auVar29._0_4_))))) {
        local_58._0_4_ = auVar23._0_4_ * auVar29._0_4_;
        uVar2 = vcmpss_avx512f(auVar7,auVar23._0_16_,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        local_68._0_4_ = (uint)bVar3 * (int)this->eta + (uint)!bVar3 * (int)(1.0 / this->eta);
        local_68._4_12_ = SUB6012((undefined1  [60])0x0,0);
        local_a8.z = (float)local_68._0_4_ * auVar29._0_4_ + auVar23._0_4_;
        auVar13._0_4_ =
             (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x +
             wo.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar13._4_4_ =
             (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y +
             wo.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar13._8_4_ =
             (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z +
             wo.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar13._12_4_ = (float)local_68._0_4_ * wi._12_4_ + wo._12_4_;
        local_a8._0_8_ = vmovlps_avx(auVar13);
        if (f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') {
          iVar6 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                       ::reg);
          if (iVar6 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                       const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                 reg);
          }
        }
        auVar21 = (undefined1  [56])0x0;
        *(long *)(in_FS_OFFSET + -0x570) = *(long *)(in_FS_OFFSET + -0x570) + 1;
        auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_a8.y)),ZEXT416((uint)local_a8.x),
                                 ZEXT416((uint)local_a8.x));
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_a8.z),ZEXT416((uint)local_a8.z),auVar7);
        auVar26 = SUB6460(ZEXT864(0),0);
        if ((auVar7._0_4_ != 0.0) || (NAN(auVar7._0_4_))) {
          VVar30 = Normalize<float>((Vector3<float> *)&local_a8);
          local_48.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar19._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar19._8_56_ = auVar21;
          local_38.x = 0.0;
          local_38.y = 0.0;
          local_48._0_8_ = vmovlps_avx(auVar19._0_16_);
          local_38.z = 1.0;
          VVar30 = FaceForward<float>((Vector3<float> *)&local_48,(Normal3<float> *)&local_38);
          auVar25._0_4_ = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar25._4_60_ = auVar26;
          auVar20._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar20._8_56_ = auVar21;
          auVar14 = auVar20._0_16_;
          local_a8._0_8_ = vmovlps_avx(auVar14);
          auVar7 = vmovshdup_avx(auVar14);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_98.y)),auVar14,
                                    ZEXT416((uint)local_98.x));
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_88.y)),auVar14,
                                   ZEXT416((uint)local_88.x));
          auVar13 = vfmadd231ss_fma(auVar13,auVar25._0_16_,ZEXT416((uint)local_98.z));
          auVar7 = vfmadd231ss_fma(auVar7,auVar25._0_16_,ZEXT416((uint)local_88.z));
          if (auVar13._0_4_ * auVar7._0_4_ <= 0.0) {
            local_a8.z = auVar25._0_4_;
            FVar8 = FrDielectric(auVar7._0_4_,this->eta);
            auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_88.y)),
                                     ZEXT416((uint)local_a8.x),ZEXT416((uint)local_88.x));
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_98.y)),
                                      ZEXT416((uint)local_a8.x),ZEXT416((uint)local_98.x));
            auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_88.z));
            auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_98.z));
            auVar7 = vfmadd213ss_fma(auVar13,local_68,auVar7);
            fVar22 = 1.0 / local_68._0_4_;
            local_68._0_4_ =
                 (float)((uint)(mode == Radiance) * (int)(fVar22 * fVar22) +
                        (uint)(mode != Radiance) * 0x3f800000) * (1.0 - FVar8);
            FVar8 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_a8);
            FVar9 = TrowbridgeReitzDistribution::G
                              (this_00,(Vector3f *)&local_88,(Vector3f *)&local_98);
            fVar22 = AbsDot<float>((Vector3<float> *)&local_98,(Vector3<float> *)&local_a8);
            fVar11 = AbsDot<float>((Vector3<float> *)&local_88,(Vector3<float> *)&local_a8);
            auVar15._0_4_ =
                 (fVar11 * fVar22 * FVar9 * FVar8) /
                 (auVar7._0_4_ * auVar7._0_4_ * (float)local_58._0_4_);
            auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar14._8_4_ = 0x7fffffff;
            auVar14._0_8_ = 0x7fffffff7fffffff;
            auVar14._12_4_ = 0x7fffffff;
            auVar7 = vandps_avx512vl(auVar15,auVar14);
            fVar22 = auVar7._0_4_ * (float)local_68._0_4_;
            goto LAB_003a1b6b;
          }
        }
        else {
          *(long *)(in_FS_OFFSET + -0x578) = *(long *)(in_FS_OFFSET + -0x578) + 1;
        }
      }
      local_78.values.values[0] = 0.0;
      local_78.values.values[1] = 0.0;
      local_78.values.values[2] = 0.0;
      local_78.values.values[3] = 0.0;
      goto LAB_003a1cae;
    }
    auVar27._0_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.x + wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar27._4_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.y + wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar27._8_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.z + wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27._12_4_ = wi._12_4_ + wo._12_4_;
    local_a8.z = auVar23._0_4_ + auVar29._0_4_;
    local_a8._0_8_ = vmovlps_avx(auVar27);
    if (((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) &&
       ((auVar29._0_4_ != 0.0 || (NAN(auVar29._0_4_))))) {
      auVar4._12_4_ = 0;
      auVar4._0_12_ = ZEXT412(0);
      uVar1 = vcmpps_avx512vl(auVar27,auVar4 << 0x20,0);
      if (((uVar1 & 1) != 0) && ((uVar1 >> 1 & 1) != 0)) {
        auVar7 = ZEXT816(0) << 0x20;
        if ((local_a8.z == 0.0) && (!NAN(local_a8.z))) goto LAB_003a1b62;
      }
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      local_58 = vandps_avx(auVar23._0_16_,auVar12);
      auVar26 = ZEXT1260(local_58._4_12_);
      local_68 = vandps_avx(auVar29._0_16_,auVar12);
      auVar21 = ZEXT856(local_68._8_8_);
      VVar30 = Normalize<float>((Vector3<float> *)&local_a8);
      local_a8.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar21;
      local_a8._0_8_ = vmovlps_avx(auVar17._0_16_);
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 1.0;
      VVar30 = FaceForward<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_48);
      auVar24._0_4_ = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar24._4_60_ = auVar26;
      auVar18._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar21;
      auVar7 = vmovshdup_avx(auVar18._0_16_);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_98.y)),auVar18._0_16_,
                               ZEXT416((uint)local_98.x));
      auVar7 = vfmadd231ss_fma(auVar7,auVar24._0_16_,ZEXT416((uint)local_98.z));
      FVar8 = FrDielectric(auVar7._0_4_,this->eta);
      FVar9 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_a8);
      FVar10 = TrowbridgeReitzDistribution::G(this_00,(Vector3f *)&local_88,(Vector3f *)&local_98);
      auVar7 = ZEXT416((uint)((FVar10 * FVar9 * FVar8) /
                             ((float)local_68._0_4_ * 4.0 * (float)local_58._0_4_)));
    }
LAB_003a1b62:
    fVar22 = auVar7._0_4_;
  }
  else {
    fVar22 = 0.0;
  }
LAB_003a1b6b:
  SampledSpectrum::SampledSpectrum(&local_78,fVar22);
LAB_003a1cae:
  aVar5.values[2] = local_78.values.values[2];
  aVar5.values[3] = local_78.values.values[3];
  aVar5.values[0] = local_78.values.values[0];
  aVar5.values[1] = local_78.values.values[1];
  return (array<float,_4>)(array<float,_4>)aVar5.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (mfDistrib.EffectivelySpecular())
            return SampledSpectrum(0);
        if (SameHemisphere(wo, wi)) {
            // Compute reflection at non-delta dielectric interface
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            Vector3f wh = wi + wo;
            // Handle degenerate cases for microfacet reflection
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return SampledSpectrum(0.);
            if (wh.x == 0 && wh.y == 0 && wh.z == 0)
                return SampledSpectrum(0.);
            wh = Normalize(wh);
            Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
            return SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                   (4 * cosTheta_i * cosTheta_o));

        } else {
            // Compute transmission at non-delta dielectric interface
            Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wh = wo + wi * etap;
            CHECK_RARE(1e-6, LengthSquared(wh) == 0);
            if (LengthSquared(wh) == 0)
                return {};
            wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

            // both on same side?
            if (Dot(wi, wh) * Dot(wo, wh) > 0)
                return {};

            Float F = FrDielectric(Dot(wo, wh), eta);
            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
            return SampledSpectrum((1 - F) * factor *
                                   std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                            AbsDot(wi, wh) * AbsDot(wo, wh) /
                                            (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
        }
    }